

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O2

VirtualIterator<Kernel::TypedTermList> __thiscall
Kernel::EqHelper::getRewritableVarsIterator
          (EqHelper *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *unstableVars,
          Literal *lit,Ordering *ord)

{
  Result RVar1;
  TermList *pTVar2;
  RewritableVarsIt *this_00;
  RewritableVarsIt RStack_248;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
  local_1e8;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
  local_1b0;
  FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>
  local_178;
  RewritableVarsIt local_e0;
  RewritableVarsIt local_80;
  
  RVar1 = Ordering::getEqualityArgumentOrder(ord,lit);
  switch(RVar1) {
  case GREATER:
  case EQUAL:
    pTVar2 = (lit->super_Term)._args + (*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    break;
  case LESS:
    pTVar2 = (lit->super_Term)._args +
             ((ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - 1);
    break;
  case INCOMPARABLE:
    RewritableVarsIt::RewritableVarsIt(&local_80,unstableVars,&lit->super_Term,false);
    Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&RStack_248,&local_80);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              ((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                *)&local_178,(IterTraits<Kernel::RewritableVarsIt> *)&RStack_248);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent(&local_1b0,
                 (IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                  *)&local_178);
    Lib::
    pvi<Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::TypedTermList>,unsigned_long>(Lib::Stack<Kernel::TypedTermList>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::TypedTermList>>>>
              ((Lib *)this,&local_1b0);
    Lib::Stack<Kernel::TypedTermList>::~Stack((Stack<Kernel::TypedTermList> *)&local_1b0);
    Lib::
    FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>
    ::~FilterMapIter(&local_178);
    RewritableVarsIt::~RewritableVarsIt(&RStack_248);
    this_00 = &local_80;
    goto LAB_004233f8;
  default:
    goto switchD_004232bf_default;
  }
  if (((ulong)pTVar2->_content & 3) == 0) {
    RewritableVarsIt::RewritableVarsIt(&local_e0,unstableVars,(Term *)pTVar2->_content,true);
    Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&RStack_248,&local_e0);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              ((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                *)&local_178,(IterTraits<Kernel::RewritableVarsIt> *)&RStack_248);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent(&local_1e8,
                 (IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                  *)&local_178);
    Lib::
    pvi<Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::TypedTermList>,unsigned_long>(Lib::Stack<Kernel::TypedTermList>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::TypedTermList>>>>
              ((Lib *)this,&local_1e8);
    Lib::Stack<Kernel::TypedTermList>::~Stack((Stack<Kernel::TypedTermList> *)&local_1e8);
    Lib::
    FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>
    ::~FilterMapIter(&local_178);
    RewritableVarsIt::~RewritableVarsIt(&RStack_248);
    this_00 = &local_e0;
LAB_004233f8:
    RewritableVarsIt::~RewritableVarsIt(this_00);
  }
  else {
switchD_004232bf_default:
    Lib::VirtualIterator<Kernel::TypedTermList>::getEmpty();
  }
  return (VirtualIterator<Kernel::TypedTermList>)(IteratorCore<Kernel::TypedTermList> *)this;
}

Assistant:

VirtualIterator<TypedTermList> EqHelper::getRewritableVarsIterator(DHSet<unsigned>* unstableVars, Literal* lit, const Ordering& ord)
{
  ASS(lit->isEquality());
    
  TermList sel;
  switch(ord.getEqualityArgumentOrder(lit)) {
  case Ordering::INCOMPARABLE: {
    return pvi(iterTraits(RewritableVarsIt(unstableVars, lit))
      .unique()
      .persistent());
  }
  case Ordering::EQUAL:
  case Ordering::GREATER:
    sel=*lit->nthArgument(0);
    break;
  case Ordering::LESS:
    sel=*lit->nthArgument(1);
    break;
#if VDEBUG
  default:
    ASSERTION_VIOLATION;
#endif
  }
  if (!sel.isTerm()) {
    return VirtualIterator<TypedTermList>::getEmpty();
  }
  return pvi(iterTraits(RewritableVarsIt(unstableVars, sel.term(), true)).unique().persistent());
}